

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O1

void __thiscall
gmlc::networking::TcpConnection::handle_read
          (TcpConnection *this,error_code *error,size_t bytes_transferred)

{
  pointer pcVar1;
  bool bVar2;
  unsigned_long uVar3;
  pointer pcVar4;
  __int_type_conflict3 _Var5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  __shared_ptr<gmlc::networking::TcpConnection,(__gnu_cxx::_Lock_policy)2> local_78 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  __shared_ptr<gmlc::networking::TcpConnection,(__gnu_cxx::_Lock_policy)2> local_68 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  __shared_ptr<gmlc::networking::TcpConnection,(__gnu_cxx::_Lock_policy)2> local_58 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (((this->triggerhalt)._M_base._M_i & 1U) != 0) {
    LOCK();
    (this->state)._M_i = HALTED;
    UNLOCK();
    concurrency::TriggerVariable::trigger(&this->receivingHalt);
    return;
  }
  if (error->_M_value == 0) {
    std::__shared_ptr<gmlc::networking::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<gmlc::networking::TcpConnection,void>
              (local_58,(__weak_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)
                        this);
    local_b8._M_dataplus._M_p =
         (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_98._M_dataplus._M_p =
         (pointer)((this->residBufferSize).super___atomic_base<unsigned_long>._M_i +
                  bytes_transferred);
    if ((this->dataCall).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    uVar3 = (*(this->dataCall)._M_invoker)
                      ((_Any_data *)&this->dataCall,
                       (shared_ptr<gmlc::networking::TcpConnection> *)local_58,(char **)&local_b8,
                       (unsigned_long *)&local_98);
    if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
    }
    if (uVar3 < (this->residBufferSize).super___atomic_base<unsigned_long>._M_i + bytes_transferred)
    {
      if (uVar3 != 0) {
        pcVar4 = (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar1 = pcVar4 + uVar3;
        pcVar4 = pcVar4 + (((this->residBufferSize).super___atomic_base<unsigned_long>._M_i +
                           bytes_transferred) - (long)pcVar1);
        if (pcVar4 != (pointer)0x0) {
          memmove((this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start,pcVar1,(size_t)pcVar4);
        }
      }
      LOCK();
      (this->residBufferSize).super___atomic_base<unsigned_long>._M_i =
           (bytes_transferred - uVar3) +
           (this->residBufferSize).super___atomic_base<unsigned_long>._M_i;
      UNLOCK();
    }
    else {
      LOCK();
      (this->residBufferSize).super___atomic_base<unsigned_long>._M_i = 0;
      UNLOCK();
      local_b8._M_dataplus._M_p = local_b8._M_dataplus._M_p & 0xffffffffffffff00;
      std::vector<char,_std::allocator<char>_>::_M_fill_assign
                (&this->data,
                 (long)(this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,(value_type *)&local_b8);
    }
LAB_00419774:
    LOCK();
    (this->state)._M_i = WAITING;
    UNLOCK();
    startReceive(this);
  }
  else {
    std::error_code::error_code<asio::error::basic_errors,void>
              ((error_code *)&local_b8,operation_aborted);
    if ((error->_M_cat != (error_category *)local_b8._M_string_length) ||
       (error->_M_value != (int)local_b8._M_dataplus._M_p)) {
      if (bytes_transferred != 0) {
        std::__shared_ptr<gmlc::networking::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<gmlc::networking::TcpConnection,void>
                  (local_68,(__weak_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                             *)this);
        local_b8._M_dataplus._M_p =
             (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_98._M_dataplus._M_p =
             (pointer)((this->residBufferSize).super___atomic_base<unsigned_long>._M_i +
                      bytes_transferred);
        if ((this->dataCall).super__Function_base._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        uVar3 = (*(this->dataCall)._M_invoker)
                          ((_Any_data *)&this->dataCall,
                           (shared_ptr<gmlc::networking::TcpConnection> *)local_68,
                           (char **)&local_b8,(unsigned_long *)&local_98);
        if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
        }
        if (uVar3 < (this->residBufferSize).super___atomic_base<unsigned_long>._M_i +
                    bytes_transferred) {
          if (uVar3 != 0) {
            pcVar4 = (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pcVar1 = pcVar4 + uVar3;
            pcVar4 = pcVar4 + (((this->residBufferSize).super___atomic_base<unsigned_long>._M_i +
                               bytes_transferred) - (long)pcVar1);
            if (pcVar4 != (pointer)0x0) {
              memmove((this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,pcVar1,(size_t)pcVar4);
            }
          }
          _Var5 = (bytes_transferred - uVar3) +
                  (this->residBufferSize).super___atomic_base<unsigned_long>._M_i;
        }
        else {
          _Var5 = 0;
        }
        LOCK();
        (this->residBufferSize).super___atomic_base<unsigned_long>._M_i = _Var5;
        UNLOCK();
      }
      if ((this->errorCall).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::error_code::error_code<asio::error::misc_errors,void>((error_code *)&local_b8,eof);
        if ((error->_M_cat != (error_category *)local_b8._M_string_length) ||
           (error->_M_value != (int)local_b8._M_dataplus._M_p)) {
          std::error_code::error_code<asio::error::basic_errors,void>
                    ((error_code *)&local_b8,connection_reset);
          if ((error->_M_cat != (error_category *)local_b8._M_string_length) ||
             (error->_M_value != (int)local_b8._M_dataplus._M_p)) {
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"receive error ","")
            ;
            (**(code **)(*(long *)error->_M_cat + 0x20))(&local_48,error->_M_cat,error->_M_value);
            std::operator+(&local_b8,&local_98,&local_48);
            logger(this,0,(string *)&local_b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_48._M_dataplus._M_p != &local_48.field_2) {
              operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
          }
        }
      }
      else {
        std::__shared_ptr<gmlc::networking::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<gmlc::networking::TcpConnection,void>
                  (local_78,(__weak_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                             *)this);
        if ((this->errorCall).super__Function_base._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        bVar2 = (*(this->errorCall)._M_invoker)
                          ((_Any_data *)&this->errorCall,
                           (shared_ptr<gmlc::networking::TcpConnection> *)local_78,error);
        if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
        }
        if (bVar2) goto LAB_00419774;
      }
    }
    LOCK();
    (this->state)._M_i = HALTED;
    UNLOCK();
    concurrency::TriggerVariable::trigger(&this->receivingHalt);
  }
  return;
}

Assistant:

void TcpConnection::handle_read(
    const std::error_code& error,
    size_t bytes_transferred)
{
    if (triggerhalt.load(std::memory_order_acquire)) {
        state = ConnectionStates::HALTED;
        receivingHalt.trigger();
        return;
    }
    if (!error) {
        auto used = dataCall(
            shared_from_this(),
            data.data(),
            bytes_transferred + residBufferSize);
        if (used < (bytes_transferred + residBufferSize)) {
            if (used > 0) {
                std::copy(
                    data.data() + used,
                    data.data() + bytes_transferred + residBufferSize,
                    data.data());
            }
            residBufferSize = bytes_transferred + residBufferSize - used;
        } else {
            residBufferSize = 0;
            data.assign(data.size(), 0);
        }
        state = ConnectionStates::WAITING;
        startReceive();
    } else if (error == asio::error::operation_aborted) {
        state = ConnectionStates::HALTED;
        receivingHalt.trigger();
        return;
    } else {
        // there was an error
        if (bytes_transferred > 0) {
            auto used = dataCall(
                shared_from_this(),
                data.data(),
                bytes_transferred + residBufferSize);
            if (used < (bytes_transferred + residBufferSize)) {
                if (used > 0) {
                    std::copy(
                        data.data() + used,
                        data.data() + bytes_transferred + residBufferSize,
                        data.data());
                }
                residBufferSize = bytes_transferred + residBufferSize - used;
            } else {
                residBufferSize = 0;
            }
        }
        if (errorCall) {
            if (errorCall(shared_from_this(), error)) {
                state = ConnectionStates::WAITING;
                startReceive();
            } else {
                state = ConnectionStates::HALTED;
                receivingHalt.trigger();
            }
        } else if (error != asio::error::eof) {
            if (error != asio::error::connection_reset) {
                logger(0, std::string("receive error ") + error.message());
            }
            state = ConnectionStates::HALTED;
            receivingHalt.trigger();
        } else {
            state = ConnectionStates::HALTED;
            receivingHalt.trigger();
        }
    }
}